

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  short sVar1;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> _Var2;
  fieldnode *pfVar3;
  char cVar4;
  _Bool _Var5;
  __type _Var6;
  FIELD *pFVar7;
  long *plVar8;
  cmValue cVar9;
  cmCursesLongMessageForm *pcVar10;
  long lVar11;
  _func_int **pp_Var12;
  pointer pcVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  pointer ppfVar18;
  pointer pcVar19;
  int iVar20;
  uint uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FORM *pFVar22;
  allocator<char> local_1d9;
  fieldnode *local_1d8;
  char local_1c9;
  pointer local_1c8;
  int key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  FIELD *local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1a8;
  pointer local_1a0;
  string searchstr;
  cmAlphaNum local_158;
  string local_128;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  char debugMessage [128];
  
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
switchD_0014e422_caseD_71:
    return;
  }
  local_1b8 = &this->SearchString;
  local_1a8 = &this->HelpMessage;
  uVar21 = 0;
LAB_0014e1c4:
  while( true ) {
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    uVar16 = 0xffffffff;
    if (this->SearchMode == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&searchstr
                     ,"Search: ",local_1b8);
      std::_Optional_payload_base<std::__cxx11::string>::
      _Optional_payload_base<std::__cxx11::string&>
                ((_Optional_payload_base<std::__cxx11::string> *)&local_108,(cmAlphaNum *)&searchstr
                );
      UpdateStatusBar(this,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_108);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_108);
      PrintKeys(this,1);
      move(uVar21 - 5);
      iVar20 = -1;
      if (_stdscr != 0) {
        iVar20 = *(short *)(_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,iVar20,1);
      refresh();
      std::__cxx11::string::~string((string *)&searchstr);
    }
    key = wgetch(_stdscr);
    uVar21 = uVar16;
    if (_stdscr != 0) break;
LAB_0014e2a0:
    if (key == 0x71) {
      return;
    }
  }
  sVar1 = *(short *)(_stdscr + 6);
  uVar21 = (int)*(short *)(_stdscr + 4) + 1;
  if (*(short *)(_stdscr + 4) < 5 || sVar1 < 0x40) goto LAB_0014e2a0;
  pFVar7 = current_field((this->super_cmCursesForm).Form);
  plVar8 = (long *)field_userptr(pFVar7);
  if (this->SearchMode != true) {
    if ((plVar8 == (long *)0x0) ||
       (cVar4 = (**(code **)(*plVar8 + 0x10))(plVar8,&key,this,_stdscr), cVar4 == '\0'))
    goto LAB_0014e3d1;
    this->OkToGenerate = false;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    goto switchD_0014e422_caseD_65;
  }
  if ((key == 0x157) || (key == 10)) {
    this->SearchMode = false;
    if ((this->SearchString)._M_string_length != 0) {
      JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
      std::__cxx11::string::_M_assign((string *)&this->OldSearchString);
    }
    (this->SearchString)._M_string_length = 0;
    *(this->SearchString)._M_dataplus._M_p = '\0';
  }
  else if (((key & 0xffffffdfU) - 0x41 < 0x1a) || (key == 0x5f || key - 0x30U < 10)) {
    if ((this->SearchString)._M_string_length < (ulong)(ushort)(sVar1 - 9)) {
      std::__cxx11::string::push_back((char)local_1b8);
    }
  }
  else if ((((key == 8) || (key == 0x14a)) || (key == 0x107)) &&
          ((this->SearchString)._M_string_length != 0)) {
    std::__cxx11::string::pop_back();
  }
LAB_0014e3d1:
  if (this->SearchMode != false) goto switchD_0014e422_caseD_65;
  snprintf(debugMessage,0x80,"Main form handling input, key: %d",(ulong)(uint)key);
  cmCursesForm::LogMessage(debugMessage);
  switch(key) {
  case 99:
    Configure(this,0);
    break;
  case 100:
    if ((this->NumberOfVisibleEntries != 0) && (this->IsEmpty == false)) {
      this->OkToGenerate = false;
      pFVar7 = current_field((this->super_cmCursesForm).Form);
      iVar20 = field_index(pFVar7);
      lVar11 = (long)iVar20;
      if (iVar20 == 2) {
        ppfVar18 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_1d8 = (fieldnode *)0x0;
      }
      else {
        ppfVar18 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (this->NumberOfVisibleEntries * 3 + -1 == lVar11) {
          local_1d8 = ppfVar18[lVar11 + -5];
        }
        else {
          local_1d8 = ppfVar18[lVar11 + 1];
        }
      }
      pcVar13 = (pointer)field_userptr(ppfVar18[lVar11 + -2]);
      if (pcVar13 != (pointer)0x0) {
        _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
        super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
             (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
               _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
        local_1c8 = pcVar13;
        pcVar14 = (char *)(**(code **)((long)(((pcVar13->Label)._M_t.
                                               super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                                               .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>.
                                              _M_head_impl)->super_cmCursesWidget).Value.field_2.
                                             _M_local_buf + 8))();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&searchstr,pcVar14,(allocator<char> *)&local_158);
        cmState::RemoveCacheEntry
                  ((cmState *)
                   _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&searchstr);
        std::__cxx11::string::~string((string *)&searchstr);
        searchstr._M_dataplus._M_p = (pointer)&searchstr.field_2;
        searchstr._M_string_length = 0;
        searchstr.field_2._M_local_buf[0] = '\0';
        if (local_1d8 != (FIELD *)0x0) {
          plVar8 = (long *)field_userptr(local_1d8);
          (**(code **)(*plVar8 + 0x28))(plVar8);
          std::__cxx11::string::assign((char *)&searchstr);
        }
        uVar17 = 0xffffffff;
        uVar21 = uVar16;
        if (_stdscr != 0) {
          uVar21 = (int)*(short *)(_stdscr + 4) + 1;
          uVar17 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        pcVar14 = (char *)(**(code **)((long)(((local_1c8->Label)._M_t.
                                               super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                                               .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>.
                                              _M_head_impl)->super_cmCursesWidget).Value.field_2.
                                             _M_local_buf + 8))();
        RemoveEntry(this,pcVar14);
        RePost(this);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar17,(ulong)uVar21);
        if (local_1d8 != (fieldnode *)0x0) {
          local_1d8 = (fieldnode *)
                      (this->Entries).
                      super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_1a0 = (this->Entries).
                      super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_1b0 = (FIELD *)((long)local_1a0 - (long)local_1d8);
          pcVar13 = (pointer)((long)local_1b0 >> 8);
          lVar11 = 0;
          while( true ) {
            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&local_1d8->nrow + lVar11);
            if ((long)pcVar13 < 1) break;
            local_1c8 = pcVar13;
            _Var6 = std::operator==(&searchstr,__rhs);
            pfVar3 = local_1d8;
            if (_Var6) {
              pcVar19 = (pointer)((long)&local_1d8->status + lVar11);
              goto LAB_0014ebe7;
            }
            _Var6 = std::operator==(&searchstr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&local_1d8->type + lVar11));
            if (_Var6) {
              pcVar19 = (pointer)((long)&pfVar3->sprev + lVar11);
              goto LAB_0014ebe7;
            }
            _Var6 = std::operator==(&searchstr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&pfVar3[1].page + lVar11));
            if (_Var6) {
              pcVar19 = (pointer)((long)&pfVar3[1].fcol + lVar11);
              goto LAB_0014ebe7;
            }
            _Var6 = std::operator==(&searchstr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&pfVar3[1].arg + lVar11));
            if (_Var6) {
              pcVar19 = (pointer)((long)&local_1d8[1].link + lVar11);
              goto LAB_0014ebe7;
            }
            pcVar13 = (pointer)((long)&local_1c8[-1].EntryWidth + 3);
            lVar11 = lVar11 + 0x100;
          }
          lVar15 = (long)local_1b0 - lVar11 >> 6;
          pcVar13 = (pointer)((long)&local_1d8->status + lVar11);
          if (lVar15 == 1) {
LAB_0014ebcd:
            _Var6 = std::operator==(&searchstr,&pcVar13->Key);
            pcVar19 = pcVar13;
            if (!_Var6) {
              pcVar19 = local_1a0;
            }
          }
          else if (lVar15 == 3) {
            local_1c8 = pcVar13;
            _Var6 = std::operator==(&searchstr,__rhs);
            pcVar19 = local_1c8;
            if (!_Var6) {
              pcVar13 = (pointer)((long)&local_1d8->sprev + lVar11);
              goto LAB_0014ebae;
            }
          }
          else {
            pcVar19 = local_1a0;
            if (lVar15 == 2) {
LAB_0014ebae:
              _Var6 = std::operator==(&searchstr,&pcVar13->Key);
              pcVar19 = pcVar13;
              if (!_Var6) {
                pcVar13 = pcVar13 + 1;
                goto LAB_0014ebcd;
              }
            }
          }
LAB_0014ebe7:
          if (pcVar19 !=
              (this->Entries).
              super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            set_current_field((this->super_cmCursesForm).Form,
                              ((pcVar19->Entry)._M_t.
                               super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>
                               .super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl)->Field)
            ;
          }
        }
        std::__cxx11::string::~string((string *)&searchstr);
      }
    }
    break;
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
    break;
  case 0x67:
    if (this->OkToGenerate == true) {
      Generate(this);
      return;
    }
    break;
  case 0x68:
    uVar21 = uVar16;
    if (_stdscr != 0) {
      uVar21 = (int)*(short *)(_stdscr + 4) + 1;
      uVar16 = (int)*(short *)(_stdscr + 6) + 1;
    }
    local_1d8 = (fieldnode *)CONCAT44(local_1d8._4_4_,uVar16);
    local_1b0 = current_field((this->super_cmCursesForm).Form);
    iVar20 = field_index(local_1b0);
    plVar8 = (long *)field_userptr((this->Fields).
                                   super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[(long)iVar20 + -2]);
    local_1c8 = (pointer)(**(code **)(*plVar8 + 0x28))(plVar8);
    _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
    super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
         (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t
           .super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&searchstr,(char *)local_1c8,(allocator<char> *)&local_158);
    cVar9 = cmState::GetCacheEntryValue
                      ((cmState *)
                       _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&searchstr);
    std::__cxx11::string::~string((string *)&searchstr);
    if (cVar9.Value == (string *)0x0) {
LAB_0014e8a5:
      std::__cxx11::string::assign
                ((char *)((local_1a8->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    else {
      _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&searchstr,(char *)local_1c8,(allocator<char> *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"HELPSTRING",&local_1d9);
      cVar9 = cmState::GetCacheEntryProperty
                        ((cmState *)
                         _Var2.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&searchstr,
                         (string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&searchstr);
      if (cVar9.Value == (string *)0x0) goto LAB_0014e8a5;
      searchstr._M_dataplus._M_p = &DAT_00000013;
      searchstr._M_string_length = (size_type)anon_var_dwarf_35b16;
      local_158.View_._M_len = strlen((char *)local_1c8);
      local_158.View_._M_str = (char *)local_1c8;
      local_1d9 = (allocator<char>)0xa;
      local_1c9 = '\n';
      cmStrCat<char,char[33],std::__cxx11::string,char>
                (&local_128,(cmAlphaNum *)&searchstr,&local_158,(char *)&local_1d9,
                 (char (*) [33])"Help string for this option is: ",cVar9.Value,&local_1c9);
      std::__cxx11::string::operator=
                ((string *)
                 ((local_1a8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1),(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
    }
    pcVar10 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar10,local_1a8,"Help",NoScroll);
    cmCursesForm::CurrentForm = (cmCursesForm *)pcVar10;
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[3])
              (pcVar10,1,1,(ulong)local_1d8 & 0xffffffff,(ulong)uVar21);
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar10);
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
              (this,1,1,(ulong)local_1d8 & 0xffffffff,(ulong)uVar21);
    pFVar22 = (this->super_cmCursesForm).Form;
    pFVar7 = local_1b0;
    goto LAB_0014e92e;
  case 0x6a:
switchD_0014e422_caseD_6a:
    pFVar7 = current_field((this->super_cmCursesForm).Form);
    iVar20 = field_index(pFVar7);
    if (this->NumberOfVisibleEntries * 3 + -1 == (long)iVar20) goto LAB_0014e1c4;
    _Var5 = new_page((this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)iVar20 + 1]);
    pFVar22 = (this->super_cmCursesForm).Form;
    if (_Var5) {
LAB_0014e544:
      iVar20 = 0x200;
    }
    else {
      iVar20 = 0x204;
    }
LAB_0014e89b:
    form_driver(pFVar22,iVar20);
    break;
  case 0x6b:
switchD_0014e422_caseD_6b:
    pFVar7 = current_field((this->super_cmCursesForm).Form);
    iVar20 = field_index(pFVar7);
    if (iVar20 == 2) goto LAB_0014e1c4;
    _Var5 = new_page((this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)iVar20 + -2]);
    pFVar22 = (this->super_cmCursesForm).Form;
    if (!_Var5) {
      iVar20 = 0x205;
      goto LAB_0014e89b;
    }
    form_driver(pFVar22,0x201);
    pFVar22 = (this->super_cmCursesForm).Form;
    pFVar7 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar20 + -3];
LAB_0014e92e:
    set_current_field(pFVar22,pFVar7);
    break;
  case 0x6c:
    uVar21 = uVar16;
    if (_stdscr != 0) {
      uVar21 = (int)*(short *)(_stdscr + 4) + 1;
      uVar16 = (int)*(short *)(_stdscr + 6) + 1;
    }
    local_1d8 = (fieldnode *)CONCAT44(local_1d8._4_4_,uVar16);
    pcVar10 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm
              (pcVar10,&this->Outputs,"CMake produced the following output",NoScroll);
    cmCursesForm::CurrentForm = (cmCursesForm *)pcVar10;
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[3])
              (pcVar10,1,1,(ulong)local_1d8 & 0xffffffff,(ulong)uVar21);
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar10);
    pp_Var12 = (this->super_cmCursesForm)._vptr_cmCursesForm;
    uVar17 = (ulong)local_1d8 & 0xffffffff;
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    goto LAB_0014e832;
  case 0x6e:
    if ((this->OldSearchString)._M_string_length != 0) {
      JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
    }
    break;
  case 0x71:
    goto switchD_0014e422_caseD_71;
  case 0x74:
    this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
    uVar17 = 0xffffffff;
    uVar21 = uVar16;
    if (_stdscr != 0) {
      uVar21 = (int)*(short *)(_stdscr + 4) + 1;
      uVar17 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
    }
    RePost(this);
    pp_Var12 = (this->super_cmCursesForm)._vptr_cmCursesForm;
LAB_0014e832:
    (*pp_Var12[3])(this,1,1,uVar17,(ulong)uVar21);
    break;
  default:
    if (key == 4) {
LAB_0014e540:
      pFVar22 = (this->super_cmCursesForm).Form;
      goto LAB_0014e544;
    }
    if (key == 0xe) goto switchD_0014e422_caseD_6a;
    if (key == 0x10) goto switchD_0014e422_caseD_6b;
    if (key == 0x15) {
LAB_0014e532:
      pFVar22 = (this->super_cmCursesForm).Form;
      iVar20 = 0x201;
      goto LAB_0014e89b;
    }
    if (key == 0x2f) {
      this->SearchMode = true;
      std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[7]>
                ((_Optional_payload_base<std::__cxx11::string> *)&local_e0,"Search");
      UpdateStatusBar(this,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_e0);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_e0);
      PrintKeys(this,1);
      iVar20 = -1;
      if (_stdscr != 0) {
        iVar20 = *(short *)(_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,iVar20,1);
      refresh();
    }
    else {
      if (key == 0x153) goto LAB_0014e532;
      if (key == 0x103) goto switchD_0014e422_caseD_6b;
      if (key == 0x152) goto LAB_0014e540;
      if (key == 0x102) goto switchD_0014e422_caseD_6a;
    }
  }
switchD_0014e422_caseD_65:
  iVar20 = -1;
  if (_stdscr != 0) {
    iVar20 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar20,1);
  wrefresh(_stdscr);
  goto LAB_0014e1c4;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0;
  int y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr);
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

#ifdef _WIN32
    if (key == KEY_RESIZE) {
      HandleResize();
    }
#endif // _WIN32

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString.clear();
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.pop_back();
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      snprintf(debugMessage, sizeof(debugMessage),
               "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        cmValue helpString = nullptr;

        cmValue existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          this->HelpMessage[1] =
            cmStrCat("Current option is: ", curField, '\n',
                     "Help string for this option is: ", *helpString, '\n');
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->HelpMessage, "Help",
          cmCursesLongMessageForm::ScrollBehavior::NoScroll);
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Outputs, "CMake produced the following output",
          cmCursesLongMessageForm::ScrollBehavior::NoScroll);
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        this->AdvancedMode = !this->AdvancedMode;
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries && !this->IsEmpty) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt = std::find_if(
              this->Entries.begin(), this->Entries.end(),
              [&nextVal](cmCursesCacheEntryComposite const& entry) {
                return nextVal == entry.Key;
              });

            if (nextEntryIt != this->Entries.end()) {
              set_current_field(this->Form, nextEntryIt->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}